

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CGUISkin.cpp
# Opt level: O0

void __thiscall
irr::gui::CGUISkin::draw3DMenuPane(CGUISkin *this,IGUIElement *element,rect<int> *r,rect<int> *clip)

{
  undefined8 uVar1;
  long *plVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined8 in_RCX;
  int *in_RDX;
  undefined8 in_RSI;
  long *in_RDI;
  SColor c2;
  SColor c1;
  rect<int> rect;
  undefined8 local_30;
  undefined8 local_28;
  undefined8 local_20;
  int *local_18;
  
  if (in_RDI[0x4b] != 0) {
    uVar1 = *(undefined8 *)in_RDX;
    local_28 = *(undefined8 *)(in_RDX + 2);
    local_30._4_4_ = (int)((ulong)uVar1 >> 0x20);
    if (*(int *)((long)in_RDI + 0x264) == 2) {
      local_30._0_4_ = (int)uVar1;
      local_30 = CONCAT44(local_30._4_4_ + -3,(int)local_30);
      (**(code **)(*in_RDI + 0x60))(in_RDI,in_RSI,&local_30,in_RCX);
    }
    else {
      local_28 = CONCAT44(local_30._4_4_ + 1,(int)local_28);
      plVar2 = (long *)in_RDI[0x4b];
      local_30 = uVar1;
      local_20 = in_RCX;
      local_18 = in_RDX;
      uVar3 = (**(code **)*in_RDI)(in_RDI,3);
      (**(code **)(*plVar2 + 0x198))(plVar2,uVar3,&local_30,local_20);
      local_28 = CONCAT44(local_18[3],(int)local_30 + 1);
      plVar2 = (long *)in_RDI[0x4b];
      uVar3 = (**(code **)*in_RDI)(in_RDI,3);
      (**(code **)(*plVar2 + 0x198))(plVar2,uVar3,&local_30,local_20);
      local_30._0_4_ = local_18[2] + -1;
      local_28._0_4_ = local_18[2];
      local_30._4_4_ = local_18[1];
      local_28._4_4_ = local_18[3];
      plVar2 = (long *)in_RDI[0x4b];
      uVar3 = (**(code **)*in_RDI)(in_RDI,0);
      (**(code **)(*plVar2 + 0x198))(plVar2,uVar3,&local_30,local_20);
      local_30 = CONCAT44(local_30._4_4_ + 1,(int)local_30 + -1);
      local_28 = CONCAT44(local_28._4_4_ + -1,(int)local_28 + -1);
      plVar2 = (long *)in_RDI[0x4b];
      uVar3 = (**(code **)*in_RDI)(in_RDI,1);
      (**(code **)(*plVar2 + 0x198))(plVar2,uVar3,&local_30,local_20);
      local_30._0_4_ = *local_18;
      local_30._4_4_ = local_18[3] + -1;
      local_28._4_4_ = local_18[3];
      local_28._0_4_ = local_18[2];
      plVar2 = (long *)in_RDI[0x4b];
      uVar3 = (**(code **)*in_RDI)(in_RDI,0);
      (**(code **)(*plVar2 + 0x198))(plVar2,uVar3,&local_30,local_20);
      local_30 = CONCAT44(local_30._4_4_ + -1,(int)local_30 + 1);
      local_28 = CONCAT44(local_28._4_4_ + -1,(int)local_28 + -1);
      plVar2 = (long *)in_RDI[0x4b];
      uVar3 = (**(code **)*in_RDI)(in_RDI,1);
      (**(code **)(*plVar2 + 0x198))(plVar2,uVar3,&local_30,local_20);
      local_30._0_4_ = (int)*(undefined8 *)local_18;
      local_30._4_4_ = (int)((ulong)*(undefined8 *)local_18 >> 0x20);
      local_30 = CONCAT44(local_30._4_4_ + 1,(int)local_30 + 1);
      local_28._0_4_ = (int)*(undefined8 *)(local_18 + 2);
      local_28._4_4_ = (int)((ulong)*(undefined8 *)(local_18 + 2) >> 0x20);
      local_28 = CONCAT44(local_28._4_4_ + -2,(int)local_28 + -2);
      if ((*(byte *)(in_RDI + 0x4c) & 1) == 0) {
        plVar2 = (long *)in_RDI[0x4b];
        uVar3 = (**(code **)*in_RDI)(in_RDI,2);
        (**(code **)(*plVar2 + 0x198))(plVar2,uVar3,&local_30,local_20);
      }
      else {
        uVar3 = (**(code **)*in_RDI)(in_RDI,2);
        uVar4 = (**(code **)*in_RDI)(in_RDI,1);
        (**(code **)(*(long *)in_RDI[0x4b] + 0x1a0))
                  ((long *)in_RDI[0x4b],&local_30,uVar3,uVar3,uVar4,uVar4,local_20);
      }
    }
  }
  return;
}

Assistant:

void CGUISkin::draw3DMenuPane(IGUIElement *element,
		const core::rect<s32> &r, const core::rect<s32> *clip)
{
	if (!Driver)
		return;

	core::rect<s32> rect = r;

	if (Type == EGST_BURNING_SKIN) {
		rect.UpperLeftCorner.Y -= 3;
		draw3DButtonPaneStandard(element, rect, clip);
		return;
	}

	// in this skin, this is exactly what non pressed buttons look like,
	// so we could simply call
	// draw3DButtonPaneStandard(element, rect, clip);
	// here.
	// but if the skin is transparent, this doesn't look that nice. So
	// We draw it a little bit better, with some more draw2DRectangle calls,
	// but there aren't that much menus visible anyway.

	rect.LowerRightCorner.Y = rect.UpperLeftCorner.Y + 1;
	Driver->draw2DRectangle(getColor(EGDC_3D_HIGH_LIGHT), rect, clip);

	rect.LowerRightCorner.Y = r.LowerRightCorner.Y;
	rect.LowerRightCorner.X = rect.UpperLeftCorner.X + 1;
	Driver->draw2DRectangle(getColor(EGDC_3D_HIGH_LIGHT), rect, clip);

	rect.UpperLeftCorner.X = r.LowerRightCorner.X - 1;
	rect.LowerRightCorner.X = r.LowerRightCorner.X;
	rect.UpperLeftCorner.Y = r.UpperLeftCorner.Y;
	rect.LowerRightCorner.Y = r.LowerRightCorner.Y;
	Driver->draw2DRectangle(getColor(EGDC_3D_DARK_SHADOW), rect, clip);

	rect.UpperLeftCorner.X -= 1;
	rect.LowerRightCorner.X -= 1;
	rect.UpperLeftCorner.Y += 1;
	rect.LowerRightCorner.Y -= 1;
	Driver->draw2DRectangle(getColor(EGDC_3D_SHADOW), rect, clip);

	rect.UpperLeftCorner.X = r.UpperLeftCorner.X;
	rect.UpperLeftCorner.Y = r.LowerRightCorner.Y - 1;
	rect.LowerRightCorner.Y = r.LowerRightCorner.Y;
	rect.LowerRightCorner.X = r.LowerRightCorner.X;
	Driver->draw2DRectangle(getColor(EGDC_3D_DARK_SHADOW), rect, clip);

	rect.UpperLeftCorner.X += 1;
	rect.LowerRightCorner.X -= 1;
	rect.UpperLeftCorner.Y -= 1;
	rect.LowerRightCorner.Y -= 1;
	Driver->draw2DRectangle(getColor(EGDC_3D_SHADOW), rect, clip);

	rect = r;
	rect.UpperLeftCorner.X += 1;
	rect.UpperLeftCorner.Y += 1;
	rect.LowerRightCorner.X -= 2;
	rect.LowerRightCorner.Y -= 2;

	if (!UseGradient)
		Driver->draw2DRectangle(getColor(EGDC_3D_FACE), rect, clip);
	else {
		const video::SColor c1 = getColor(EGDC_3D_FACE);
		const video::SColor c2 = getColor(EGDC_3D_SHADOW);
		Driver->draw2DRectangle(rect, c1, c1, c2, c2, clip);
	}
}